

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

void __thiscall f8n::db::Statement::Statement(Statement *this,char *sql,Connection *connection)

{
  unique_lock<std::mutex> lock;
  
  this->_vptr_Statement = (_func_int **)&PTR__Statement_0021c3d8;
  this->stmt = (sqlite3_stmt *)0x0;
  this->connection = connection;
  this->modifiedRows = 0;
  std::unique_lock<std::mutex>::unique_lock(&lock,&connection->mutex);
  sqlite3_prepare_v2(this->connection->connection,sql,-1,&this->stmt,(char **)0x0);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

Statement::Statement(const char* sql, Connection &connection)
: connection(&connection)
, stmt(nullptr)
, modifiedRows(0) {
    std::unique_lock<std::mutex> lock(connection.mutex);

    sqlite3_prepare_v2(
        this->connection->connection, sql, -1, &this->stmt, nullptr);
}